

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddConstraint
          (DuckTableEntry *this,ClientContext *context,AddConstraintInfo *info)

{
  SchemaCatalogEntry *pSVar1;
  pointer puVar2;
  __node_base_ptr p_Var3;
  Catalog *catalog;
  __node_base_ptr this_00;
  undefined8 uVar4;
  CreateTableInfo *this_01;
  pointer pCVar5;
  pointer pCVar6;
  UniqueConstraint *pUVar7;
  Binder *pBVar8;
  string *table;
  type __args_1;
  type __args_2;
  type info_00;
  DuckTableEntry *this_02;
  InternalException *this_03;
  CatalogException *this_04;
  __node_base_ptr in_RCX;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *constraint;
  __node_base_ptr this_05;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  string existing_name;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_160;
  undefined1 local_151;
  undefined1 local_150 [16];
  shared_ptr<duckdb::DataTable,_true> local_140;
  undefined1 local_130 [8];
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  pointer local_d8;
  __node_base _Stack_d0;
  __buckets_ptr local_c8;
  bool local_c0;
  ClientContext *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  local_b0 = (ClientContext *)info;
  local_98._24_8_ = this;
  local_98._32_8_ = in_RCX;
  this_01 = (CreateTableInfo *)operator_new(0x1d8);
  local_128._0_8_ = local_128 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_01,pSVar1,(string *)local_128);
  local_160._M_head_impl = this_01;
  if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_);
  }
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_160);
  Value::operator=(&(pCVar5->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  ColumnList::Copy((ColumnList *)local_128,(ColumnList *)&(context->config).asof_loop_join_threshold
                  );
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_160);
  local_98._0_8_ =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_118._0_8_;
  local_a8._0_8_ =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8._8_8_ =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  local_128._0_8_ = (_Hash_node_base *)0x0;
  local_128._8_8_ = (ClientContext *)0x0;
  local_118._0_8_ = 0;
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_a8
            );
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pCVar5->columns).name_map,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_118 + 8));
  puVar2 = (pCVar5->columns).physical_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)_Stack_d0._M_nxt;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_c8;
  local_d8 = (pointer)0x0;
  _Stack_d0._M_nxt = (_Hash_node_base *)0x0;
  local_c8 = (__buckets_ptr)0x0;
  if (puVar2 == (pointer)0x0) {
    (pCVar5->columns).allow_duplicate_names = local_c0;
  }
  else {
    operator_delete(puVar2);
    (pCVar5->columns).allow_duplicate_names = local_c0;
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8);
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_118 + 8));
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
             local_128);
  this_05 = (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
  p_Var3 = (context->config).set_variables._M_h._M_single_bucket;
  if (this_05 != p_Var3) {
    do {
      pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_160);
      pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)this_05);
      (*pCVar6->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_128,pCVar6);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar5->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_128);
      if ((_Hash_node_base *)local_128._0_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_128._0_8_)[1]._M_nxt)();
      }
      this_05 = this_05 + 1;
    } while (this_05 != p_Var3);
  }
  this_00 = (__node_base_ptr)(local_98._32_8_ + 0x78);
  pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator->
                     ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                       *)this_00);
  if (pCVar6->type == UNIQUE) {
    pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)this_00);
    pUVar7 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar6);
    local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)TableCatalogEntry::GetPrimaryKey((TableCatalogEntry *)context);
    if ((local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0) && (pUVar7->is_primary_key != false)) {
      optional_ptr<duckdb::Constraint,_true>::CheckValid
                ((optional_ptr<duckdb::Constraint,_true> *)&local_140);
      (**(code **)&(((((enable_shared_from_this<duckdb::ClientContext> *)
                      &(local_140.internal.
                        super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_enable_shared_from_this<duckdb::DataTable>)->__weak_this_).internal.
                     super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->db
                   ).internal.
                   super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>)
                (local_128);
      this_04 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_a8._0_8_ = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"table \"%s\" can have only one primary key: %s","");
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)&context->interrupted,
                 (long)&(((context->registered_state).
                          super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                          .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                         _M_head_impl)->lock).super___mutex_base._M_mutex +
                 *(long *)&context->interrupted);
      local_70._0_8_ = local_70 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_128._0_8_,
                 (pointer)((long)&(((string *)local_128._8_8_)->_M_dataplus)._M_p + local_128._0_8_)
                );
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                (this_04,(string *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      __cxa_throw(this_04,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_160);
    pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)this_00);
    (*pCVar6->_vptr_Constraint[3])(local_128,pCVar6);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar5->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               local_128);
    if ((_Hash_node_base *)local_128._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_128._0_8_)[1]._M_nxt)();
    }
    Binder::CreateBinder
              ((Binder *)local_a8,local_b0,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_a8);
    table = (string *)
            unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator*
                      ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                        *)this_00);
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_160);
    unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
    operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                *)&local_160);
    Binder::BindConstraint
              ((Binder *)local_130,(Constraint *)pBVar8,table,(ColumnList *)&pCVar5->table);
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_a8);
    local_150._8_8_ = local_160._M_head_impl;
    local_160._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_150,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar8,(SchemaCatalogEntry *)(local_150 + 8));
    if ((CreateTableInfo *)local_150._8_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_150._8_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_150._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                         ((shared_ptr<duckdb::DataTable,_true> *)
                          &(context->config).user_variables._M_h._M_bucket_count);
    __args_2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator*((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                            *)local_130);
    local_128._0_8_ = (_Hash_node_base *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,duckdb::BoundConstraint&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8),(DataTable **)local_128
               ,(allocator<duckdb::DataTable> *)&local_151,local_b0,__args_1,__args_2);
    shared_ptr<duckdb::DataTable,_true>::shared_ptr
              (&local_140,(shared_ptr<duckdb::DataTable> *)local_128);
    if ((ClientContext *)local_128._8_8_ != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
    }
    catalog = (Catalog *)(context->config).max_expression_depth;
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    info_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_150);
    this_02 = (DuckTableEntry *)operator_new(0x298);
    local_128._0_8_ =
         local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_128._8_8_ =
         local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((ClientContext *)
        local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (ClientContext *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(local_140.internal.
                   super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count)->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(local_140.internal.
                        super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(local_140.internal.
                   super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count)->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(local_140.internal.
                        super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
      }
    }
    DuckTableEntry(this_02,catalog,pSVar1,info_00,(shared_ptr<duckdb::DataTable,_true> *)local_128);
    if ((ClientContext *)local_128._8_8_ != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
    }
    uVar4 = local_98._24_8_;
    *(_func_int ***)local_98._24_8_ = (_func_int **)this_02;
    if ((ClientContext *)
        local_140.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.internal.
                 super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((element_type *)local_150._0_8_ != (element_type *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_150,
                 (BoundCreateTableInfo *)local_150._0_8_);
    }
    if ((__uniq_ptr_impl<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>_>)
        local_130 !=
        (__uniq_ptr_impl<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>_>)0x0
       ) {
      (**(code **)(*(long *)local_130 + 8))();
    }
    if ((pointer)local_a8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if (local_160._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_160._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)uVar4;
  }
  this_03 = (InternalException *)__cxa_allocate_exception(0x10);
  local_128._0_8_ = local_128 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"unsupported constraint type in ALTER TABLE statement","");
  InternalException::InternalException(this_03,(string *)local_128);
  __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddConstraint(ClientContext &context, AddConstraintInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;

	// Copy all columns and constraints to the modified table.
	create_info->columns = columns.Copy();
	for (const auto &constraint : constraints) {
		create_info->constraints.push_back(constraint->Copy());
	}

	if (info.constraint->type == ConstraintType::UNIQUE) {
		const auto &unique = info.constraint->Cast<UniqueConstraint>();
		const auto existing_pk = GetPrimaryKey();

		if (unique.is_primary_key && existing_pk) {
			auto existing_name = existing_pk->ToString();
			throw CatalogException("table \"%s\" can have only one primary key: %s", name, existing_name);
		}
		create_info->constraints.push_back(info.constraint->Copy());

	} else {
		throw InternalException("unsupported constraint type in ALTER TABLE statement");
	}

	// We create a physical table with a new constraint and a new unique index.
	const auto binder = Binder::CreateBinder(context);
	const auto bound_constraint = binder->BindConstraint(*info.constraint, create_info->table, create_info->columns);
	const auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);

	auto new_storage = make_shared_ptr<DataTable>(context, *storage, *bound_constraint);
	auto new_entry = make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
	return std::move(new_entry);
}